

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Connection::Connection
          (Connection *this,uint64_t insertionOrder,uint64_t src,uint64_t dest,string *prop,
          Document *doc)

{
  bool bVar1;
  ObjectMap *pOVar2;
  bool local_91;
  _Self local_68;
  _Self local_60;
  _Self local_58 [3];
  _Self local_40;
  Document *local_38;
  Document *doc_local;
  string *prop_local;
  uint64_t dest_local;
  uint64_t src_local;
  uint64_t insertionOrder_local;
  Connection *this_local;
  
  this->insertionOrder = insertionOrder;
  local_38 = doc;
  doc_local = (Document *)prop;
  prop_local = (string *)dest;
  dest_local = src;
  src_local = insertionOrder;
  insertionOrder_local = (uint64_t)this;
  std::__cxx11::string::string((string *)&this->prop,(string *)prop);
  this->src = dest_local;
  this->dest = (uint64_t)prop_local;
  this->doc = local_38;
  pOVar2 = Document::Objects(local_38);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
       ::find(pOVar2,&dest_local);
  pOVar2 = Document::Objects(local_38);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
       ::end(pOVar2);
  bVar1 = std::operator!=(&local_40,local_58);
  if (!bVar1) {
    __assert_fail("doc.Objects().find(src) != doc.Objects().end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                  ,0x2a0,
                  "Assimp::FBX::Connection::Connection(uint64_t, uint64_t, uint64_t, const std::string &, const Document &)"
                 );
  }
  local_91 = true;
  if (prop_local != (string *)0x0) {
    pOVar2 = Document::Objects(local_38);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
         ::find(pOVar2,(key_type_conflict1 *)&prop_local);
    pOVar2 = Document::Objects(local_38);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
         ::end(pOVar2);
    local_91 = std::operator!=(&local_60,&local_68);
  }
  if (local_91 == false) {
    __assert_fail("!dest || doc.Objects().find(dest) != doc.Objects().end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                  ,0x2a2,
                  "Assimp::FBX::Connection::Connection(uint64_t, uint64_t, uint64_t, const std::string &, const Document &)"
                 );
  }
  return;
}

Assistant:

Connection::Connection(uint64_t insertionOrder,  uint64_t src, uint64_t dest, const std::string& prop,
        const Document& doc)

: insertionOrder(insertionOrder)
, prop(prop)
, src(src)
, dest(dest)
, doc(doc)
{
    ai_assert(doc.Objects().find(src) != doc.Objects().end());
    // dest may be 0 (root node)
    ai_assert(!dest || doc.Objects().find(dest) != doc.Objects().end());
}